

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MultiIterFinishSetup(Fts5Index *p,Fts5Iter *pIter)

{
  ushort uVar1;
  Fts5Data *pFVar2;
  int iVar3;
  uint uVar4;
  
  if (1 < pIter->nSeg) {
    uVar4 = pIter->nSeg + 1;
    do {
      iVar3 = fts5MultiIterDoCompare(pIter,uVar4 - 2);
      if (iVar3 != 0) {
        if (p->rc == 0) {
          (*pIter->aSeg[iVar3].xNext)(p,pIter->aSeg + iVar3,(int *)0x0);
        }
        fts5MultiIterAdvanced(p,pIter,iVar3,uVar4 - 2);
      }
      uVar4 = uVar4 - 1;
    } while (2 < uVar4);
  }
  uVar1 = pIter->aFirst[1].iFirst;
  pFVar2 = pIter->aSeg[uVar1].pLeaf;
  (pIter->base).bEof = pFVar2 == (Fts5Data *)0x0;
  pIter->iSwitchRowid = pIter->aSeg[uVar1].iRowid;
  if ((((pIter->bSkipEmpty == '\0') || (p->rc != 0)) || (pFVar2 == (Fts5Data *)0x0)) ||
     (pIter->aSeg[uVar1].nPos != 0)) {
    iVar3 = fts5MultiIterIsDeleted(pIter);
    if (iVar3 == 0) {
      if ((pIter->base).bEof != '\0') {
        return;
      }
      (*pIter->xSetOutputs)(pIter,pIter->aSeg + pIter->aFirst[1].iFirst);
      return;
    }
  }
  fts5MultiIterNext(p,pIter,0,0);
  return;
}

Assistant:

static void fts5MultiIterFinishSetup(Fts5Index *p, Fts5Iter *pIter){
  int iIter;
  for(iIter=pIter->nSeg-1; iIter>0; iIter--){
    int iEq;
    if( (iEq = fts5MultiIterDoCompare(pIter, iIter)) ){
      Fts5SegIter *pSeg = &pIter->aSeg[iEq];
      if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
      fts5MultiIterAdvanced(p, pIter, iEq, iIter);
    }
  }
  fts5MultiIterSetEof(pIter);
  fts5AssertMultiIterSetup(p, pIter);

  if( (pIter->bSkipEmpty && fts5MultiIterIsEmpty(p, pIter))
   || fts5MultiIterIsDeleted(pIter)
  ){
    fts5MultiIterNext(p, pIter, 0, 0);
  }else if( pIter->base.bEof==0 ){
    Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
    pIter->xSetOutputs(pIter, pSeg);
  }
}